

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetris.cpp
# Opt level: O2

void decide(int *blockForEnemy,int *finalX,int *finalY,int *finalO)

{
  int tmp;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  local_50[1] = (code *)0x0;
  local_50[0] = evaluate2_sweet;
  local_38 = std::
             _Function_handler<double_(Board,_const_Block_&,_double_&,_bool),_double_(*)(Board,_const_Block_&,_double_&,_bool)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<double_(Board,_const_Block_&,_double_&,_bool),_double_(*)(Board,_const_Block_&,_double_&,_bool)>
             ::_M_manager;
  set_Eval((function<double_(Board,_const_Block_&,_double_&,_bool)> *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  precalc(&gameBoard,&myele,&enemyele,&enemyht);
  Place_Turn(1,&gameBoard,gameBoard.currBotColor,gameBoard.currBlockType,finalX,finalY,finalO,&tmp);
  Place_Turn(1,&gameBoard,gameBoard.currBotColor ^ 1,gameBoard.enemyType,&tmp,&tmp,&tmp,
             blockForEnemy);
  return;
}

Assistant:

void decide(int &blockForEnemy, int &finalX, int &finalY, int &finalO)
{
    set_Eval(evaluate2_sweet);
    int tmp;
    precalc(gameBoard, myele, enemyele, enemyht);
    //printf("%d %d %d\n", myele, enemyele, enemyht);

    Place_Turn(1, gameBoard, gameBoard.currBotColor, gameBoard.currBlockType, finalX, finalY, finalO, tmp);
    //while(1);
    Place_Turn(1, gameBoard, gameBoard.currBotColor ^ 1, gameBoard.enemyType, tmp, tmp, tmp, blockForEnemy);
    //naive_place(gameBoard, gameBoard.currBotColor, gameBoard.currBlockType, evaluate3, finalX, finalY, finalO);
    //naive_jam(gameBoard, evaluate3, blockForEnemy);
}